

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

lua_State * lua_newthread(lua_State *L)

{
  lua_State *L1;
  int iVar1;
  global_State *pgVar2;
  StkId pTVar3;
  undefined8 *puVar4;
  
  pgVar2 = L->l_G;
  if (0 < pgVar2->GCdebt) {
    luaC_step(L);
  }
  puVar4 = (undefined8 *)luaM_realloc_(L,(void *)0x0,8,0xd8);
  L1 = (lua_State *)(puVar4 + 1);
  *(byte *)((long)puVar4 + 0x11) = pgVar2->currentwhite & 3;
  *(undefined1 *)(puVar4 + 2) = 8;
  puVar4[1] = pgVar2->allgc;
  pgVar2->allgc = (GCObject *)L1;
  pTVar3 = L->top;
  (pTVar3->value_).gc = (GCObject *)L1;
  pTVar3->tt_ = 0x48;
  L->top = L->top + 1;
  puVar4[4] = pgVar2;
  puVar4[8] = 0;
  puVar4[9] = 0;
  puVar4[5] = 0;
  *(undefined2 *)((long)puVar4 + 0x12) = 0;
  *(undefined4 *)(puVar4 + 0x18) = 0;
  puVar4[0xb] = L1;
  puVar4[0xc] = 0;
  puVar4[0x16] = 0;
  *(undefined8 *)((long)puVar4 + 0xc4) = 0;
  *(undefined1 *)((long)puVar4 + 0xd4) = 1;
  *(undefined8 *)((long)puVar4 + 0xcc) = 1;
  *(undefined1 *)((long)puVar4 + 0x14) = 0;
  puVar4[0x17] = 0;
  *(sig_atomic_t *)(puVar4 + 0x1a) = L->hookmask;
  iVar1 = L->basehookcount;
  *(int *)((long)puVar4 + 0xc4) = iVar1;
  puVar4[0x16] = L->hook;
  *(int *)(puVar4 + 0x19) = iVar1;
  *puVar4 = *(undefined8 *)&pgVar2->mainthread[-1].hookmask;
  stack_init(L1,L);
  return L1;
}

Assistant:

LUA_API lua_State *lua_newthread(lua_State *L) {
    global_State *g = G(L);
    lua_State *L1;
    lua_lock(L);
    luaC_checkGC(L);
    /* create new thread */
    L1 = &cast(LX *, luaM_newobject(L, LUA_TTHREAD, sizeof(LX)))->l;
    L1->marked = luaC_white(g);
    L1->tt = LUA_TTHREAD;
    /* link it on list 'allgc' */
    L1->next = g->allgc;
    g->allgc = obj2gco(L1);
    /* anchor it on L stack */
    setthvalue(L, L->top, L1);
    api_incr_top(L);
    preinit_thread(L1, g);
    L1->hookmask = L->hookmask;
    L1->basehookcount = L->basehookcount;
    L1->hook = L->hook;
    resethookcount(L1);
    /* initialize L1 extra space */
    memcpy(lua_getextraspace(L1), lua_getextraspace(g->mainthread),
           LUA_EXTRASPACE);
    luai_userstatethread(L, L1);
    stack_init(L1, L);  /* init stack */
    lua_unlock(L);
    return L1;
}